

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::bin_int(sequence *__return_storage_ptr__,spec *param_1)

{
  anon_class_1_0_00000001 local_101;
  repeat_at_least local_100;
  literal local_e8;
  sequence local_d0;
  character_either local_b0;
  either local_90;
  character_either local_70;
  character_either local_50;
  character local_30;
  
  local_e8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045aa58;
  local_e8.value_ = "0b";
  local_e8.size_ = 2;
  bin_int::anon_class_1_0_00000001::operator()(&local_70,&local_101);
  bin_int::anon_class_1_0_00000001::operator()(&local_b0,&local_101);
  local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045a940;
  local_30.value_ = '_';
  bin_int::anon_class_1_0_00000001::operator()(&local_50,&local_101);
  sequence::sequence<toml::detail::character,toml::detail::character_either>
            (&local_d0,&local_30,&local_50);
  either::either<toml::detail::character_either,toml::detail::sequence>
            (&local_90,&local_b0,&local_d0);
  repeat_at_least::repeat_at_least<toml::detail::either>(&local_100,0,&local_90);
  sequence::
  sequence<toml::detail::literal,toml::detail::character_either,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_e8,&local_70,&local_100);
  if (local_100.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_100.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_100.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_90.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_d0.others_);
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_50.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_b0.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_70.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence bin_int(const spec&)
{
    const auto digit01 = []() {
        return character_either{char_type('0'), char_type('1')};
    };
    return sequence(
            literal("0b"),
            digit01(),
            repeat_at_least(0,
                either(
                    digit01(),
                    sequence(character(char_type('_')), digit01())
                )
            )
        );
}